

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
          (any *this,shared_ptr<cs::name_space> *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_00344e40 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = (baseHolder *)(&DAT_00344c30)[DAT_00344e40];
    DAT_00344e40 = DAT_00344e40 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_00333230;
  pbVar2[1]._vptr_baseHolder =
       (_func_int **)(args->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (args->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  pbVar2[2]._vptr_baseHolder = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((DAT_00344820 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_00344820];
    DAT_00344820 = DAT_00344820 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 1;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}